

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall QPDFJob::initializeFromArgv(QPDFJob *this,char **argv,char *progname_env)

{
  char *progname_env_00;
  long lVar1;
  QPDFArgParser qap;
  ArgParser ap;
  __shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2> local_130;
  __shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2> local_120 [3];
  ArgParser local_f0;
  
  for (lVar1 = 0; argv[lVar1] != (char *)0x0; lVar1 = lVar1 + 1) {
  }
  progname_env_00 = "QPDF_EXECUTABLE";
  if (progname_env != (char *)0x0) {
    progname_env_00 = progname_env;
  }
  QPDFArgParser::QPDFArgParser((QPDFArgParser *)local_120,(int)lVar1,argv,progname_env_00);
  QPDFArgParser::getProgname_abi_cxx11_((string *)&local_f0,(QPDFArgParser *)local_120);
  setMessagePrefix(this,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  config((QPDFJob *)&local_130);
  std::__shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2> *)&local_f0,local_120
            );
  std::__shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f0.c_main.super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>,
             &local_130);
  local_f0.user_password._M_dataplus._M_p = (pointer)&local_f0.user_password.field_2;
  local_f0.accumulated_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.accumulated_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.c_enc.super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f0.c_enc.super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.c_uo.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f0.c_uo.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.c_pages.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f0.c_pages.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.c_att.super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f0.c_att.super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.c_copy_att.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_f0.c_copy_att.super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0.accumulated_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.user_password._M_string_length = 0;
  local_f0.user_password.field_2._M_local_buf[0] = '\0';
  local_f0.owner_password._M_dataplus._M_p = (pointer)&local_f0.owner_password.field_2;
  local_f0.owner_password._M_string_length = 0;
  local_f0.owner_password.field_2._M_local_buf[0] = '\0';
  local_f0.gave_output = false;
  local_f0.called_pages_file = false;
  local_f0.called_pages_range = false;
  local_f0.used_enc_password_args = false;
  local_f0.gave_input = false;
  anon_unknown.dwarf_304bdd::ArgParser::initOptionTables(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount);
  QPDFArgParser::parseArgs(&local_f0.ap);
  anon_unknown.dwarf_304bdd::ArgParser::~ArgParser(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120[0]._M_refcount);
  return;
}

Assistant:

void
QPDFJob::initializeFromArgv(char const* const argv[], char const* progname_env)
{
    if (progname_env == nullptr) {
        progname_env = "QPDF_EXECUTABLE";
    }
    int argc = 0;
    for (auto k = argv; *k; ++k) {
        ++argc;
    }
    QPDFArgParser qap(argc, argv, progname_env);
    setMessagePrefix(qap.getProgname());
    ArgParser ap(qap, config());
    ap.parseOptions();
}